

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 subFloat128Sigs(float128 a,float128 b,flag zSign,float_status *status)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  int count;
  ulong uVar4;
  ulong a1;
  uint64_t zSig1;
  uint64_t uVar5;
  ulong a0;
  float128 fVar6;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar3 = a.high._6_2_ & 0x7fff;
  uVar2 = b.high._6_2_ & 0x7fff;
  a1 = a.low * 0x4000;
  a0 = (a.high & 0xffffffffffff) << 0xe | a.low >> 0x32;
  uVar4 = b.low * 0x4000;
  uVar5 = (b.high & 0xffffffffffff) << 0xe | b.low >> 0x32;
  count = uVar3 - uVar2;
  local_50 = uVar5;
  local_48 = a0;
  local_40 = uVar4;
  local_38 = a1;
  if (count == 0 || uVar3 < uVar2) {
    if (count < 0) {
      if (uVar2 == 0x7fff) {
        if (uVar5 != 0 || uVar4 != 0) goto LAB_00b1e0ac;
        uVar4 = (ulong)(byte)~zSign << 0x3f | 0x7fff000000000000;
LAB_00b1e1b0:
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar4;
        return (float128)(auVar1 << 0x40);
      }
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        count = count + 1;
      }
      else {
        a0 = a0 | 0x4000000000000000;
      }
      local_48 = a0;
      shift128RightJamming(a0,a1,-count,&local_48,&local_38);
      uVar5 = uVar5 | 0x4000000000000000;
    }
    else {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
        uVar2 = 1;
        uVar3 = uVar2;
      }
      else if (uVar3 == 0x7fff) {
        if (((a0 == 0 && a1 == 0) && uVar4 == 0) && uVar5 == 0) {
          status->float_exception_flags = status->float_exception_flags | 1;
          uVar4 = 0x7fff800000000000;
          goto LAB_00b1e1b0;
        }
        goto LAB_00b1e0ac;
      }
      if (uVar5 < a0) goto LAB_00b1e17c;
      if (uVar5 <= a0) {
        if (uVar4 < a1) goto LAB_00b1e17c;
        if (uVar4 <= a1) {
          uVar4 = (ulong)(status->float_rounding_mode == '\x01') << 0x3f;
          goto LAB_00b1e1b0;
        }
      }
    }
    zSig1 = uVar4 - local_38;
    uVar5 = (uVar5 - local_48) - (ulong)(uVar4 < local_38);
    zSign = zSign ^ 1;
  }
  else {
    if (uVar3 == 0x7fff) {
      if (a0 == 0 && a1 == 0) {
        return a;
      }
LAB_00b1e0ac:
      fVar6 = propagateFloat128NaN(a,b,status);
      return fVar6;
    }
    if (((undefined1  [16])b & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
      count = count + -1;
    }
    else {
      uVar5 = uVar5 | 0x4000000000000000;
    }
    local_50 = uVar5;
    shift128RightJamming(uVar5,uVar4,count,&local_50,&local_40);
    a0 = a0 | 0x4000000000000000;
LAB_00b1e17c:
    uVar2 = uVar3;
    zSig1 = a1 - local_40;
    uVar5 = (a0 - local_50) - (ulong)(a1 < local_40);
  }
  fVar6 = normalizeRoundAndPackFloat128(zSign,uVar2 - 0xf,uVar5,zSig1,status);
  return fVar6;
}

Assistant:

static float128 subFloat128Sigs(float128 a, float128 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig0, aSig1, bSig0, bSig1, zSig0, zSig1;
    int32_t expDiff;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    bSig1 = extractFloat128Frac1( b );
    bSig0 = extractFloat128Frac0( b );
    bExp = extractFloat128Exp( b );
    expDiff = aExp - bExp;
    shortShift128Left( aSig0, aSig1, 14, &aSig0, &aSig1 );
    shortShift128Left( bSig0, bSig1, 14, &bSig0, &bSig1 );
    if ( 0 < expDiff ) goto aExpBigger;
    if ( expDiff < 0 ) goto bExpBigger;
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 | bSig0 | bSig1 ) {
            return propagateFloat128NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    if ( aExp == 0 ) {
        aExp = 1;
        bExp = 1;
    }
    if ( bSig0 < aSig0 ) goto aBigger;
    if ( aSig0 < bSig0 ) goto bBigger;
    if ( bSig1 < aSig1 ) goto aBigger;
    if ( aSig1 < bSig1 ) goto bBigger;
    return packFloat128(status->float_rounding_mode == float_round_down,
                        0, 0, 0);
 bExpBigger:
    if ( bExp == 0x7FFF ) {
        if (bSig0 | bSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return packFloat128( zSign ^ 1, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        ++expDiff;
    }
    else {
        aSig0 |= UINT64_C(0x4000000000000000);
    }
    shift128RightJamming( aSig0, aSig1, - expDiff, &aSig0, &aSig1 );
    bSig0 |= UINT64_C(0x4000000000000000);
 bBigger:
    sub128( bSig0, bSig1, aSig0, aSig1, &zSig0, &zSig1 );
    zExp = bExp;
    zSign ^= 1;
    goto normalizeRoundAndPack;
 aExpBigger:
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) {
        --expDiff;
    }
    else {
        bSig0 |= UINT64_C(0x4000000000000000);
    }
    shift128RightJamming( bSig0, bSig1, expDiff, &bSig0, &bSig1 );
    aSig0 |= UINT64_C(0x4000000000000000);
 aBigger:
    sub128( aSig0, aSig1, bSig0, bSig1, &zSig0, &zSig1 );
    zExp = aExp;
 normalizeRoundAndPack:
    --zExp;
    return normalizeRoundAndPackFloat128(zSign, zExp - 14, zSig0, zSig1,
                                         status);

}